

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O2

void test_z2_standart_field_operators<Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>>
               (void)

{
  uint uVar1;
  uint uVar2;
  Element_conflict EVar3;
  Zp_field_element<2U,_unsigned_int,_void> ZVar4;
  bool bVar5;
  int local_654;
  Zp_field_element<2U,_unsigned_int,_void> z22;
  Zp_field_element<2U,_unsigned_int,_void> z21;
  undefined **local_648;
  undefined1 local_640;
  undefined8 *local_638;
  char **local_630;
  int local_628 [2];
  undefined8 local_620;
  shared_count sStack_618;
  char *local_610;
  char *local_608;
  Zp_field_element<2U,_unsigned_int,_void> local_600;
  Zp_field_element<2U,_unsigned_int,_void> local_5fc;
  Zp_field_element<2U,_unsigned_int,_void> local_5f8;
  Zp_field_element<2U,_unsigned_int,_void> local_5f4;
  Zp_field_element<2U,_unsigned_int,_void> local_5f0;
  Zp_field_element<2U,_unsigned_int,_void> local_5ec;
  Zp_field_element<2U,_unsigned_int,_void> local_5e8;
  Zp_field_element<2U,_unsigned_int,_void> local_5e4;
  Zp_field_element<2U,_unsigned_int,_void> local_5e0;
  Zp_field_element<2U,_unsigned_int,_void> local_5dc;
  Zp_field_element<2U,_unsigned_int,_void> local_5d8;
  Zp_field_element<2U,_unsigned_int,_void> local_5d4;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  z22.element_ = 0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  z21.element_ = 1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x89);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4f8 = "";
  local_5d4.element_ = 1;
  Gudhi::persistence_fields::operator+((persistence_fields *)local_628,&local_5d4,&z22);
  local_610._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_500,0x89,1,2,local_628,"z21 + z22",&local_610,"1");
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x8a);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_508 = "";
  local_5d8.element_ = z21.element_;
  local_610._0_4_ = 3;
  Gudhi::persistence_fields::operator+((persistence_fields *)local_628,&local_5d8,(int *)&local_610)
  ;
  local_654 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_510,0x8a,1,2,local_628,"z21 + 3",&local_654,"0");
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x8b);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_518 = "";
  local_5dc.element_ = z22.element_;
  local_610._0_4_ = 3;
  Gudhi::persistence_fields::operator+((persistence_fields *)local_628,&local_5dc,(int *)&local_610)
  ;
  local_654 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_520,0x8b,1,2,local_628,"z22 + 3",&local_654,"1");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x8c);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_528 = "";
  local_610._0_4_ = 6;
  local_5e0.element_ = z21.element_;
  local_628[0] = Gudhi::persistence_fields::operator+((int *)&local_610,&local_5e0);
  local_654 = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_648,&local_530,0x8c,1,2,local_628,"6 + z21",&local_654,"1");
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x8d);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_538 = "";
  local_610._0_4_ = 6;
  local_5e4.element_ = z22.element_;
  local_628[0] = Gudhi::persistence_fields::operator+((int *)&local_610,&local_5e4);
  local_654 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_648,&local_540,0x8d,1,2,local_628,"6 + z22",&local_654,"0");
  local_648 = (undefined **)CONCAT44(local_648._4_4_,3);
  Gudhi::persistence_fields::operator+=(&z21,(int *)&local_648);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x8f);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_f8 = "";
  local_628[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_100,0x8f,1,2,&z21,"z21",local_628,"0");
  uVar1 = z21.element_ + z22.element_;
  uVar2 = uVar1;
  if (1 < uVar1) {
    uVar2 = uVar1 - 2;
  }
  bVar5 = CARRY4(z21.element_,z22.element_);
  z21.element_ = uVar2;
  if (bVar5) {
    z21.element_ = uVar1 - 2;
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x91);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_128 = "";
  local_628[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_130,0x91,1,2,&z21,"z21",local_628,"0");
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x94);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_158 = "";
  ZVar4.element_ = z21.element_ + 2;
  if (z22.element_ <= z21.element_) {
    ZVar4 = z21;
  }
  local_628[0] = ZVar4.element_ - z22.element_;
  local_610._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_160,0x94,1,2,local_628,"z21 - z22",&local_610,"0");
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x95);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_548 = "";
  local_5e8.element_ = z21.element_;
  local_610._0_4_ = 3;
  Gudhi::persistence_fields::operator-((persistence_fields *)local_628,&local_5e8,(int *)&local_610)
  ;
  local_654 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_550,0x95,1,2,local_628,"z21 - 3",&local_654,"1");
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x96);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_558 = "";
  local_5ec.element_ = z22.element_;
  local_610._0_4_ = 3;
  Gudhi::persistence_fields::operator-((persistence_fields *)local_628,&local_5ec,(int *)&local_610)
  ;
  local_654 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_560,0x96,1,2,local_628,"z22 - 3",&local_654,"1");
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x97);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_568 = "";
  local_610._0_4_ = 6;
  local_628[0] = Gudhi::persistence_fields::operator-((int *)&local_610,&z21);
  local_654 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_648,&local_570,0x97,1,2,local_628,"6 - z21",&local_654,"0");
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x98);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_578 = "";
  local_610._0_4_ = 6;
  local_628[0] = Gudhi::persistence_fields::operator-((int *)&local_610,&z22);
  local_654 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_648,&local_580,0x98,1,2,local_628,"6 - z22",&local_654,"0");
  local_648 = (undefined **)CONCAT44(local_648._4_4_,3);
  Gudhi::persistence_fields::operator-=(&z21,(int *)&local_648);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x9a);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_208 = "";
  local_628[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_210,0x9a,1,2,&z21,"z21",local_628,"1");
  ZVar4.element_ = z21.element_ + 2;
  if (z22.element_ <= z21.element_) {
    ZVar4 = z21;
  }
  z21.element_ = ZVar4.element_ - z22.element_;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x9c);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_238 = "";
  local_628[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_240,0x9c,1,2,&z21,"z21",local_628,"1");
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x9f);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_588 = "";
  local_5f0.element_ = z21.element_;
  Gudhi::persistence_fields::operator*((persistence_fields *)local_628,&local_5f0,&z22);
  local_610._0_4_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_590,0x9f,1,2,local_628,"z21 * z22",&local_610,"0");
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0xa0);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_598 = "";
  local_5f4.element_ = z21.element_;
  local_610._0_4_ = 3;
  Gudhi::persistence_fields::operator*((persistence_fields *)local_628,&local_5f4,(int *)&local_610)
  ;
  local_654 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_5a0,0xa0,1,2,local_628,"z21 * 3",&local_654,"1");
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0xa1);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_5a8 = "";
  local_5f8.element_ = z22.element_;
  local_610._0_4_ = 3;
  Gudhi::persistence_fields::operator*((persistence_fields *)local_628,&local_5f8,(int *)&local_610)
  ;
  local_654 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_5b0,0xa1,1,2,local_628,"z22 * 3",&local_654,"0");
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0xa2);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_5b8 = "";
  local_610._0_4_ = 6;
  local_5fc.element_ = z21.element_;
  local_628[0] = Gudhi::persistence_fields::operator*((int *)&local_610,&local_5fc);
  local_654 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_648,&local_5c0,0xa2,1,2,local_628,"6 * z21",&local_654,"0");
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0xa3);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_5c8 = "";
  local_610 = (char *)CONCAT44(local_610._4_4_,6);
  local_600.element_ = z22.element_;
  local_628[0] = Gudhi::persistence_fields::operator*((int *)&local_610,&local_600);
  local_654 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_648,&local_5d0,0xa3,1,2,local_628,"6 * z22",&local_654,"0");
  local_648 = (undefined **)CONCAT44(local_648._4_4_,3);
  Gudhi::persistence_fields::operator*=(&z21,(int *)&local_648);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0xa5);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_308 = "";
  local_628[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_310,0xa5,1,2,&z21,"z21",local_628,"1");
  z21.element_ = Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
                           (z21.element_,z22.element_);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0xa7);
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129ae8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_630 = (char **)0x11e044;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_338 = "";
  local_628[0] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>,int>
            (&local_648,&local_340,0xa7,1,2,&z21,"z21",local_628,"0");
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0xaa);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "z21 == z22";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_368 = "";
  local_630 = &local_610;
  local_628[0]._0_1_ = (persistence_fields)(z21.element_ == z22.element_);
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_370,0xaa,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0xab);
  EVar3 = Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>::_get_value<int,void>(0)
  ;
  local_628[0]._0_1_ = (persistence_fields)(EVar3 == z21.element_);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "z21 == 0";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_398 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_3a0,0xab,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0xac);
  EVar3 = Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>::_get_value<int,void>(0)
  ;
  local_628[0]._0_1_ = (persistence_fields)(EVar3 == z21.element_);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "0 == z21";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3c8 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_3d0,0xac,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0xad);
  EVar3 = Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>::_get_value<int,void>(0)
  ;
  local_628[0]._0_1_ = (persistence_fields)(EVar3 == z22.element_);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "z22 == 0";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_3f8 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_400,0xad,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0xae);
  EVar3 = Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>::_get_value<int,void>(0)
  ;
  local_628[0]._0_1_ = (persistence_fields)(EVar3 == z22.element_);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "0 == z22";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_428 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_430,0xae,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0xaf);
  local_654 = 1;
  local_628[0]._0_1_ = (persistence_fields)Gudhi::persistence_fields::operator!=(&z21,&local_654);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "z21 != 1";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_458 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_460,0xaf,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_470,0xb0);
  local_654 = 3;
  local_628[0]._0_1_ = (persistence_fields)Gudhi::persistence_fields::operator!=(&local_654,&z21);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "3 != z21";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_488 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_490,0xb0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0xb1);
  local_654 = 1;
  local_628[0]._0_1_ = (persistence_fields)Gudhi::persistence_fields::operator!=(&z22,&local_654);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "z22 != 1";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4b8 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_4c0,0xb1,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0xb2);
  local_654 = 3;
  bVar5 = Gudhi::persistence_fields::operator!=(&local_654,&z22);
  local_628[0] = CONCAT31(local_628[0]._1_3_,bVar5);
  local_620 = 0;
  sStack_618.pi_ = (sp_counted_base *)0x0;
  local_610 = "3 != z22";
  local_608 = "";
  local_640 = 0;
  local_648 = &PTR__lazy_ostream_00129be8;
  local_638 = &boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_4e8 = "";
  local_630 = &local_610;
  boost::test_tools::tt_detail::report_assertion(local_628,&local_648,&local_4f0,0xb2,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_618);
  return;
}

Assistant:

void test_z2_standart_field_operators() {
  Z2 z21(7);
  Z2 z22(2);

  //+
  BOOST_CHECK_EQUAL(z21 + z22, 1);
  BOOST_CHECK_EQUAL(z21 + 3, 0);
  BOOST_CHECK_EQUAL(z22 + 3, 1);
  BOOST_CHECK_EQUAL(6 + z21, 1);
  BOOST_CHECK_EQUAL(6 + z22, 0);
  z21 += 3;
  BOOST_CHECK_EQUAL(z21, 0);
  z21 += z22;
  BOOST_CHECK_EQUAL(z21, 0);

  //-
  BOOST_CHECK_EQUAL(z21 - z22, 0);
  BOOST_CHECK_EQUAL(z21 - 3, 1);
  BOOST_CHECK_EQUAL(z22 - 3, 1);
  BOOST_CHECK_EQUAL(6 - z21, 0);
  BOOST_CHECK_EQUAL(6 - z22, 0);
  z21 -= 3;
  BOOST_CHECK_EQUAL(z21, 1);
  z21 -= z22;
  BOOST_CHECK_EQUAL(z21, 1);

  //*
  BOOST_CHECK_EQUAL(z21 * z22, 0);
  BOOST_CHECK_EQUAL(z21 * 3, 1);
  BOOST_CHECK_EQUAL(z22 * 3, 0);
  BOOST_CHECK_EQUAL(6 * z21, 0);
  BOOST_CHECK_EQUAL(6 * z22, 0);
  z21 *= 3;
  BOOST_CHECK_EQUAL(z21, 1);
  z21 *= z22;
  BOOST_CHECK_EQUAL(z21, 0);

  //==
  BOOST_CHECK(z21 == z22);
  BOOST_CHECK(z21 == 0);
  BOOST_CHECK(0 == z21);
  BOOST_CHECK(z22 == 0);
  BOOST_CHECK(0 == z22);
  BOOST_CHECK(z21 != 1);
  BOOST_CHECK(3 != z21);
  BOOST_CHECK(z22 != 1);
  BOOST_CHECK(3 != z22);
}